

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O2

arith_uint256 * GetBlockProof(arith_uint256 *__return_storage_ptr__,CBlockIndex *block)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  bool fOverflow;
  bool fNegative;
  base_uint<256U> local_118;
  base_uint<256U> local_f8;
  base_uint<256U> local_d8;
  base_uint<256U> local_b8;
  base_uint<256U> local_98;
  base_uint<256U> local_78;
  arith_uint256 bnTarget;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  base_uint<256U>::base_uint(&bnTarget.super_base_uint<256U>);
  arith_uint256::SetCompact
            ((arith_uint256 *)&bnTarget.super_base_uint<256U>,block->nBits,&fNegative,&fOverflow);
  if ((fNegative == false) && (fOverflow == false)) {
    bVar2 = base_uint<256U>::EqualTo(&bnTarget.super_base_uint<256U>,0);
    if (!bVar2) {
      base_uint<256U>::operator~(&local_b8,&bnTarget.super_base_uint<256U>);
      base_uint<256U>::base_uint(&local_f8,1);
      operator+(&local_d8,&bnTarget.super_base_uint<256U>,&local_f8);
      operator/(&local_98,&local_b8,&local_d8);
      base_uint<256U>::base_uint(&local_118,1);
      operator+(&local_78,&local_98,&local_118);
      base_uint<256U>::base_uint(&__return_storage_ptr__->super_base_uint<256U>,&local_78);
      goto LAB_006bfc77;
    }
  }
  base_uint<256U>::base_uint(&__return_storage_ptr__->super_base_uint<256U>,0);
LAB_006bfc77:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

arith_uint256 GetBlockProof(const CBlockIndex& block)
{
    arith_uint256 bnTarget;
    bool fNegative;
    bool fOverflow;
    bnTarget.SetCompact(block.nBits, &fNegative, &fOverflow);
    if (fNegative || fOverflow || bnTarget == 0)
        return 0;
    // We need to compute 2**256 / (bnTarget+1), but we can't represent 2**256
    // as it's too large for an arith_uint256. However, as 2**256 is at least as large
    // as bnTarget+1, it is equal to ((2**256 - bnTarget - 1) / (bnTarget+1)) + 1,
    // or ~bnTarget / (bnTarget+1) + 1.
    return (~bnTarget / (bnTarget + 1)) + 1;
}